

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QtGraphicsAnchorLayout::AnchorVertex_*>::clear
          (QList<QtGraphicsAnchorLayout::AnchorVertex_*> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex_*> *this_00;
  __off_t __length;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::swap
                (in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex_*>::truncate
                (this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }